

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

void __thiscall
pbrt::PMJ02BNSampler::PMJ02BNSampler(PMJ02BNSampler *this,int samplesPerPixel,Allocator alloc)

{
  vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_> *pvVar1;
  string ret;
  string local_40;
  
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->sampleIndex = 0;
  this->dimension = 0;
  this->samplesPerPixel = samplesPerPixel;
  if (1 << (~(byte)LZCOUNT(samplesPerPixel) & 0x1e) != samplesPerPixel) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    detail::stringPrintfRecursive
              (&local_40,
               "PMJ02BNSampler results are best with power-of-4 samples per pixel (1, 4, 16, 64, ...)"
              );
    Warning((FileLoc *)0x0,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  pvVar1 = GetSortedPMJ02BNPixelSamples(samplesPerPixel,alloc,&this->pixelTileSize);
  this->pixelSamples = pvVar1;
  return;
}

Assistant:

PMJ02BNSampler::PMJ02BNSampler(int samplesPerPixel, Allocator alloc)
    : samplesPerPixel(samplesPerPixel) {
    if (!IsPowerOf4(samplesPerPixel))
        Warning("PMJ02BNSampler results are best with power-of-4 samples per "
                "pixel (1, 4, 16, 64, ...)");
    pixelSamples = GetSortedPMJ02BNPixelSamples(samplesPerPixel, alloc, &pixelTileSize);
}